

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O2

void unload_data_entries(DATA_ENTRY *data)

{
  void *pvVar1;
  int iVar2;
  char *__s1;
  
  for (; (data != (DATA_ENTRY *)0x0 && (pvVar1 = data->dat, pvVar1 != (void *)0x0)); data = data + 1
      ) {
    __s1 = data->type;
    iVar2 = strcmp(__s1,"bitmap");
    if (iVar2 == 0) {
      al_destroy_bitmap(pvVar1);
      __s1 = data->type;
    }
    iVar2 = strcmp(__s1,"font");
    if (iVar2 == 0) {
      al_destroy_font(data->dat);
      __s1 = data->type;
    }
    iVar2 = strcmp(__s1,"sample");
    if (iVar2 == 0) {
      al_destroy_sample(data->dat);
      __s1 = data->type;
    }
    iVar2 = strcmp(__s1,"music");
    if (iVar2 == 0) {
      al_destroy_audio_stream(data->dat);
    }
  }
  return;
}

Assistant:

void unload_data_entries(DATA_ENTRY *data)
{
    while (data && data->dat) {
        if (!strcmp(data->type, "bitmap")) al_destroy_bitmap(data->dat);
        if (!strcmp(data->type, "font")) al_destroy_font(data->dat);
        if (!strcmp(data->type, "sample")) al_destroy_sample(data->dat);
        if (!strcmp(data->type, "music")) al_destroy_audio_stream(data->dat);
        data++;
    }
}